

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O0

void __thiscall
vkt::wsi::anon_unknown_0::TriangleRenderer::recordFrame
          (TriangleRenderer *this,VkCommandBuffer cmdBuffer,deUint32 imageNdx,deUint32 frameNdx)

{
  DeviceInterface *pDVar1;
  VkResult VVar2;
  const_reference this_00;
  RefBase<vk::Handle<(vk::HandleType)23>_> *this_01;
  Handle<(vk::HandleType)23> *pHVar3;
  Handle<(vk::HandleType)17> *pHVar4;
  Handle<(vk::HandleType)18> *pHVar5;
  Handle<(vk::HandleType)8> *pHVar6;
  Handle<(vk::HandleType)16> *pHVar7;
  undefined8 local_a8;
  VkDeviceSize bindingOffset;
  undefined4 local_98 [2];
  VkRenderPassBeginInfo passBeginParams;
  VkClearValue clearValue;
  VkCommandBufferBeginInfo cmdBufBeginParams;
  VkFramebuffer curFramebuffer;
  deUint32 frameNdx_local;
  deUint32 imageNdx_local;
  VkCommandBuffer cmdBuffer_local;
  TriangleRenderer *this_local;
  
  curFramebuffer.m_internal._0_4_ = frameNdx;
  curFramebuffer.m_internal._4_4_ = imageNdx;
  this_00 = std::
            vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
            ::operator[](&this->m_framebuffers,(ulong)imageNdx);
  this_01 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>::operator*
                       (this_00)->super_RefBase<vk::Handle<(vk::HandleType)23>_>;
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*(this_01);
  cmdBufBeginParams.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)pHVar3->m_internal;
  clearValue._8_8_ = 0x2a;
  cmdBufBeginParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufBeginParams._4_4_ = 0;
  cmdBufBeginParams.pNext = (void *)0x0;
  cmdBufBeginParams.flags = 0;
  cmdBufBeginParams._20_4_ = 0;
  VVar2 = (*this->m_vkd->_vptr_DeviceInterface[0x49])(this->m_vkd,cmdBuffer,(long)&clearValue + 8);
  ::vk::checkResult(VVar2,"m_vkd.beginCommandBuffer(cmdBuffer, &cmdBufBeginParams)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                    ,0x4c9);
  join_0x00000010_0x00000000_ = ::vk::makeClearValueColorF32(0.125,0.25,0.75,1.0);
  local_98[0] = 0x2b;
  passBeginParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  passBeginParams._4_4_ = 0;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  passBeginParams.pNext = (void *)pHVar4->m_internal;
  passBeginParams.renderPass.m_internal = (deUint64)cmdBufBeginParams.pInheritanceInfo;
  passBeginParams.framebuffer.m_internal._0_4_ = 0;
  passBeginParams.framebuffer.m_internal._4_4_ = 0;
  passBeginParams.renderArea.offset.x = tcu::Vector<unsigned_int,_2>::x(&this->m_renderSize);
  passBeginParams.renderArea.offset.y = tcu::Vector<unsigned_int,_2>::y(&this->m_renderSize);
  passBeginParams.renderArea.extent.width = 1;
  passBeginParams._48_8_ = &passBeginParams.pClearValues;
  (*this->m_vkd->_vptr_DeviceInterface[0x74])(this->m_vkd,cmdBuffer,local_98,0);
  pDVar1 = this->m_vkd;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     (&(this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  bindingOffset = pHVar5->m_internal;
  (*pDVar1->_vptr_DeviceInterface[0x4c])(pDVar1,cmdBuffer,0,bindingOffset);
  local_a8 = 0;
  pDVar1 = this->m_vkd;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::get
                     (&(this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  (*pDVar1->_vptr_DeviceInterface[0x58])(pDVar1,cmdBuffer,0,1,pHVar6,&local_a8);
  pDVar1 = this->m_vkd;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  (*pDVar1->_vptr_DeviceInterface[0x73])(pDVar1,cmdBuffer,pHVar7->m_internal,1,0,4,&curFramebuffer);
  (*this->m_vkd->_vptr_DeviceInterface[0x59])(this->m_vkd,cmdBuffer,3,1,0);
  (*this->m_vkd->_vptr_DeviceInterface[0x76])(this->m_vkd,cmdBuffer);
  VVar2 = (*this->m_vkd->_vptr_DeviceInterface[0x4a])(this->m_vkd,cmdBuffer);
  ::vk::checkResult(VVar2,"m_vkd.endCommandBuffer(cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                    ,0x4e9);
  return;
}

Assistant:

void TriangleRenderer::recordFrame (VkCommandBuffer	cmdBuffer,
									deUint32		imageNdx,
									deUint32		frameNdx) const
{
	const VkFramebuffer	curFramebuffer	= **m_framebuffers[imageNdx];

	{
		const VkCommandBufferBeginInfo	cmdBufBeginParams	=
		{
			VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
			DE_NULL,
			(VkCommandBufferUsageFlags)0,
			(const VkCommandBufferInheritanceInfo*)DE_NULL,
		};
		VK_CHECK(m_vkd.beginCommandBuffer(cmdBuffer, &cmdBufBeginParams));
	}

	{
		const VkClearValue			clearValue		= makeClearValueColorF32(0.125f, 0.25f, 0.75f, 1.0f);
		const VkRenderPassBeginInfo	passBeginParams	=
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,
			DE_NULL,
			*m_renderPass,
			curFramebuffer,
			{
				{ 0, 0 },
				{ (deUint32)m_renderSize.x(), (deUint32)m_renderSize.y() }
			},													// renderArea
			1u,													// clearValueCount
			&clearValue,										// pClearValues
		};
		m_vkd.cmdBeginRenderPass(cmdBuffer, &passBeginParams, VK_SUBPASS_CONTENTS_INLINE);
	}

	m_vkd.cmdBindPipeline(cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

	{
		const VkDeviceSize bindingOffset = 0;
		m_vkd.cmdBindVertexBuffers(cmdBuffer, 0u, 1u, &m_vertexBuffer.get(), &bindingOffset);
	}

	m_vkd.cmdPushConstants(cmdBuffer, *m_pipelineLayout, VK_SHADER_STAGE_VERTEX_BIT, 0u, (deUint32)sizeof(deUint32), &frameNdx);
	m_vkd.cmdDraw(cmdBuffer, 3u, 1u, 0u, 0u);
	m_vkd.cmdEndRenderPass(cmdBuffer);

	VK_CHECK(m_vkd.endCommandBuffer(cmdBuffer));
}